

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas2_d.cpp
# Opt level: O1

void dger(int m,int n,double alpha,double *x,int incx,double *y,int incy,double *a,int lda)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  string local_60;
  double local_40;
  int local_34;
  
  if (m < 0) {
    iVar3 = 1;
  }
  else if (n < 0) {
    iVar3 = 2;
  }
  else if (incx == 0) {
    iVar3 = 5;
  }
  else {
    if (incy != 0) {
      local_40 = alpha;
      local_34 = incx;
      iVar3 = i4_max(1,m);
      bVar2 = iVar3 <= lda;
      iVar3 = (uint)(lda < iVar3) * 9;
      alpha = local_40;
      incx = local_34;
      goto LAB_002151d4;
    }
    iVar3 = 7;
  }
  bVar2 = false;
LAB_002151d4:
  if (bVar2) {
    if (((m != 0) && (n != 0)) && ((alpha != 0.0 || (NAN(alpha))))) {
      iVar3 = 0;
      if (incy < 1) {
        iVar3 = (1 - n) * incy;
      }
      if (incx == 1) {
        if (0 < n) {
          lVar4 = (long)iVar3;
          uVar6 = 0;
          do {
            dVar1 = y[lVar4];
            if (((dVar1 != 0.0) || (NAN(dVar1))) && (0 < m)) {
              uVar7 = 0;
              do {
                a[uVar7] = x[uVar7] * dVar1 * alpha + a[uVar7];
                uVar7 = uVar7 + 1;
              } while ((uint)m != uVar7);
            }
            lVar4 = lVar4 + incy;
            uVar6 = uVar6 + 1;
            a = a + lda;
          } while (uVar6 != (uint)n);
        }
      }
      else if (0 < n) {
        iVar5 = (1 - m) * incx;
        uVar6 = 0;
        if (0 < incx) {
          iVar5 = 0;
        }
        lVar4 = (long)iVar3;
        do {
          dVar1 = y[lVar4];
          if (((dVar1 != 0.0) || (NAN(dVar1))) && (0 < m)) {
            uVar7 = 0;
            pdVar8 = x + iVar5;
            do {
              a[uVar7] = *pdVar8 * dVar1 * alpha + a[uVar7];
              uVar7 = uVar7 + 1;
              pdVar8 = pdVar8 + incx;
            } while ((uint)m != uVar7);
          }
          lVar4 = lVar4 + incy;
          uVar6 = uVar6 + 1;
          a = a + lda;
        } while (uVar6 != (uint)n);
      }
    }
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"DGER","");
    xerbla(&local_60,iVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void dger ( int m, int n, double alpha, double x[], int incx, double y[], 
  int incy, double a[], int lda )

//****************************************************************************80
//
//  Purpose:
//
//    DGER computes A := alpha*x*y' + A.
//
//  Discussion:
//
//    DGER performs the rank 1 operation
//
//      A := alpha*x*y' + A,
//
//    where alpha is a scalar, x is an m element vector, y is an n element
//    vector and A is an m by n matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    04 April 2014
//
//  Author:
//
//    Original FORTRAN77 version by Jack Dongarra,  Jeremy Du Croz,  
//    Sven Hammarling,  Richard Hanson.
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, int M, the number of rows of the matrix A.
//    0 <= M.
//
//    Input, int N, the number of columns of the matrix A.
//    0 <= N.
//
//    Input, double ALPHA, the scalar multiplier.
//
//    Input, double X[1+(M-1)*abs(INCX)], the first vector.
//
//    Input, int INCX, the increment for elements of X.
//    INCX must not be zero.
//
//    Input, double Y[1+(N-1)*abs(INCY)], the second vector.
//
//    Input, int INCY, the increment for elements of Y.
//    INCY must not be zero.
//
//    Input/output, double A[LDA*N].  On entry, the leading M by N 
//    part of the array contains the matrix of coefficients. On exit, A is
//    overwritten by the updated matrix.
//
//    Input, int LDA, the first dimension of A as declared
//    in the calling program. max ( 1, M ) <= LDA.
//
{
  int i;
  int info;
  int ix;
  int j;
  int jy;
  int kx;
  double temp;
//
//  Test the input parameters.
//
  info = 0;
  if ( m < 0 )
  {
    info = 1;
  }
  else if ( n < 0 )
  {
    info = 2;
  }
  else if ( incx == 0 )
  {
    info = 5;
  }
  else if ( incy == 0 )
  {
    info = 7;
  }
  else if ( lda < i4_max ( 1, m ) )
  {
    info = 9;
  }

  if ( info != 0 )
  {
    xerbla ( "DGER", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( m == 0 || n == 0 || alpha == 0.0 )
  {
    return;
  }
//
//  Start the operations. In this version the elements of A are
//  accessed sequentially with one pass through A.
//
  if ( 0 < incy )
  {
    jy = 0;
  }
  else
  {
    jy = 0 - ( n - 1 ) * incy;
  }

  if ( incx == 1 )
  {
    for ( j = 0; j < n; j++ )
    {
      if ( y[jy] != 0.0 )
      {
        temp = alpha * y[jy];
        for ( i = 0; i < m; i++ )
        {
          a[i+j*lda] = a[i+j*lda] + x[i] * temp;
        }
      }
      jy = jy + incy;
    }
  }
  else
  {
    if ( 0 < incx )
    {
      kx = 0;
    }
    else
    {
      kx = 0 - ( m - 1 ) * incx;
    }
    for ( j = 0; j < n; j++ )
    {
      if ( y[jy] != 0.0 )
      {
        temp = alpha * y[jy];
        ix = kx;
        for ( i = 0; i < m; i++ )
        {
          a[i+j*lda] = a[i+j*lda] + x[ix] * temp;
          ix = ix + incx;
        }
      }
      jy = jy + incy;
    }
  }

  return;
}